

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTipPartials
          (BeagleCPUImpl<double,_1,_0> *this,int tipIndex,double *inPartials)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  double *__s;
  double *__dest;
  double *__src;
  ulong uVar6;
  void *ptr;
  double *local_38;
  
  iVar2 = -5;
  if ((-1 < tipIndex) && (tipIndex < this->kTipCount)) {
    if (this->gPartials[(uint)tipIndex] == (double *)0x0) {
      local_38 = (double *)0x0;
      posix_memalign(&local_38,0x20,(long)this->kPartialsSize << 3);
      this->gPartials[(uint)tipIndex] = local_38;
      if (this->gPartials[(uint)tipIndex] == (double *)0x0) {
        return -2;
      }
    }
    if (0 < this->kCategoryCount) {
      __s = this->gPartials[(uint)tipIndex];
      iVar2 = 0;
      do {
        iVar1 = this->kPatternCount;
        if (0 < iVar1) {
          iVar3 = 0;
          __dest = __s;
          __src = inPartials;
          do {
            memcpy(__dest,__src,(ulong)(uint)this->kStateCount << 3);
            uVar4 = this->kStateCount;
            lVar5 = (long)(int)uVar4;
            __s = __dest + lVar5;
            if ((int)uVar4 < this->kPartialsPaddedStateCount) {
              uVar6 = (ulong)(this->kPartialsPaddedStateCount + ~uVar4);
              memset(__s,0,uVar6 * 8 + 8);
              __s = __dest + uVar6 + lVar5 + 1;
            }
            __src = __src + lVar5;
            iVar3 = iVar3 + 1;
            iVar1 = this->kPatternCount;
            __dest = __s;
          } while (iVar3 < iVar1);
        }
        uVar4 = (this->kPaddedPatternCount - iVar1) * this->kPartialsPaddedStateCount;
        if (0 < (int)uVar4) {
          memset(__s,0,(ulong)uVar4 << 3);
          __s = __s + (ulong)(uVar4 - 1) + 1;
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < this->kCategoryCount);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}